

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

_Bool can_merge(FlatRange *r1,FlatRange *r2)

{
  undefined1 (*pauVar1) [24];
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  AddrRange r;
  undefined1 b [16];
  undefined1 b_00 [16];
  undefined1 b_01 [16];
  _Bool _Var2;
  Int128 *__return_storage_ptr__;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 in_stack_ffffffffffffff28;
  _Bool local_b9;
  FlatRange *r2_local;
  FlatRange *r1_local;
  
  uVar4 = (undefined8)(r1->addr).start;
  pauVar1 = (undefined1 (*) [24])((long)&(r1->addr).start + 8);
  uVar5 = *(undefined8 *)*pauVar1;
  uVar6 = (undefined8)(r1->addr).size;
  uVar7 = *(undefined8 *)((long)&(r1->addr).size + 8);
  r.size._8_8_ = in_stack_ffffffffffffff28;
  r._0_24_ = *pauVar1;
  addrrange_end(r);
  a._8_8_ = uVar5;
  a._0_8_ = uVar4;
  b._8_8_ = uVar7;
  b._0_8_ = uVar6;
  uVar3 = extraout_RDX;
  _Var2 = int128_eq((Int128)a,(Int128)b);
  local_b9 = false;
  if ((_Var2) && (local_b9 = false, r1->mr == r2->mr)) {
    __return_storage_ptr__ = int128_make64((Int128 *)r1->offset_in_region,uVar3);
    a_00._8_8_ = uVar5;
    a_00._0_8_ = uVar4;
    b_00._8_8_ = uVar7;
    b_00._0_8_ = uVar6;
    uVar3 = extraout_RDX_00;
    int128_add(__return_storage_ptr__,(Int128)a_00,(Int128)b_00);
    int128_make64((Int128 *)r2->offset_in_region,uVar3);
    a_01._8_8_ = uVar5;
    a_01._0_8_ = uVar4;
    b_01._8_8_ = uVar7;
    b_01._0_8_ = uVar6;
    _Var2 = int128_eq((Int128)a_01,(Int128)b_01);
    local_b9 = false;
    if (_Var2) {
      local_b9 = (r1->readonly & 1U) == (r2->readonly & 1U);
    }
  }
  return local_b9;
}

Assistant:

static bool can_merge(FlatRange *r1, FlatRange *r2)
{
    return int128_eq(addrrange_end(r1->addr), r2->addr.start)
        && r1->mr == r2->mr
        && int128_eq(int128_add(int128_make64(r1->offset_in_region),
                                r1->addr.size),
                     int128_make64(r2->offset_in_region))
        && r1->readonly == r2->readonly;
}